

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampTexParameterIErrors.cpp
# Opt level: O0

void __thiscall
glcts::TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIuiv
          (TextureBorderClampTexParameterIErrorsTest *this,GLenum target,GLenum pname,GLuint params,
          GLenum expected_error)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  Enum<int,_2UL> EVar4;
  Enum<int,_2UL> local_200;
  GetNameFunc local_1f0;
  int local_1e8;
  Enum<int,_2UL> local_1e0;
  char *local_1d0;
  char *local_1c8 [3];
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  GLenum local_20;
  GLenum error_code;
  GLenum expected_error_local;
  GLuint params_local;
  GLenum pname_local;
  GLenum target_local;
  TextureBorderClampTexParameterIErrorsTest *this_local;
  
  gl._4_4_ = 0;
  local_20 = expected_error;
  error_code = params;
  expected_error_local = pname;
  params_local = target;
  _pname_local = this;
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureBorderClampBase).super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_30 + 0x1348))(params_local,expected_error_local,&error_code);
  gl._4_4_ = (**(code **)(local_30 + 0x800))();
  if (local_20 != gl._4_4_) {
    this->m_test_passed = '\0';
    this_00 = tcu::TestContext::getLog
                        ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.
                         super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [33])"glTexParameterIuivEXT() failed:[");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [8])0x2b1a3bd);
    local_1c8[0] = TextureBorderClampBase::getTexTargetString
                             (&this->super_TextureBorderClampBase,params_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [9])", pname:");
    local_1d0 = TextureBorderClampBase::getPNameString
                          (&this->super_TextureBorderClampBase,expected_error_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] reported error code:[");
    EVar4 = glu::getErrorStr(gl._4_4_);
    local_1f0 = EVar4.m_getName;
    local_1e8 = EVar4.m_value;
    local_1e0.m_getName = local_1f0;
    local_1e0.m_value = local_1e8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [24])"] expected error code:[");
    EVar4 = glu::getErrorStr(local_20);
    local_200.m_getName = EVar4.m_getName;
    local_200.m_value = EVar4.m_value;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b2eb07);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return;
}

Assistant:

void TextureBorderClampTexParameterIErrorsTest::VerifyGLTexParameterIuiv(glw::GLenum target, glw::GLenum pname,
																		 glw::GLuint params, glw::GLenum expected_error)
{
	glw::GLenum			  error_code = GL_NO_ERROR;
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();

	gl.texParameterIuiv(target, pname, &params);

	error_code = gl.getError();
	if (expected_error != error_code)
	{
		m_test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << "glTexParameterIuivEXT() failed:["
						   << "target:" << getTexTargetString(target) << ", pname:" << getPNameString(pname)
						   << "] reported error code:[" << glu::getErrorStr(error_code) << "] expected error code:["
						   << glu::getErrorStr(expected_error) << "]\n"
						   << tcu::TestLog::EndMessage;
	}
}